

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::move(Tree *this,size_t node,size_t after)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  bool bVar7;
  size_t iparent;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  byte bVar11;
  csubstr cVar12;
  char *pcStack_110;
  size_t local_108;
  char *pcStack_e8;
  size_t local_e0;
  char *pcStack_c0;
  size_t local_b8;
  char *pcStack_98;
  size_t local_90;
  char msg [29];
  
  bVar11 = 0;
  if (node == 0xffffffffffffffff) {
    builtin_strncpy(msg + 0x10,"ode != NONE)",0xd);
    builtin_strncpy(msg,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar12 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_90 = cVar12.len;
    pcStack_98 = cVar12.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x6530) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x6530) << 0x40,8);
    LVar3.name.str = pcStack_98;
    LVar3.name.len = local_90;
    (*p_Var1)(msg,0x1d,LVar3,(this->m_callbacks).m_user_data);
  }
  if (node == after) {
    builtin_strncpy(msg + 0x10,"ode != after)",0xd);
    builtin_strncpy(msg,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar12 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_b8 = cVar12.len;
    pcStack_c0 = cVar12.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x6531) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x6531) << 0x40,8);
    LVar4.name.str = pcStack_c0;
    LVar4.name.len = local_b8;
    (*p_Var1)(msg,0x1e,LVar4,(this->m_callbacks).m_user_data);
  }
  bVar7 = is_root(this,node);
  if (bVar7) {
    builtin_strncpy(msg + 0x10," is_root(node",0xd);
    builtin_strncpy(msg,"check failed: (!",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar12 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_e0 = cVar12.len;
    pcStack_e8 = cVar12.str;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x6532) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x6532) << 0x40,8);
    LVar5.name.str = pcStack_e8;
    LVar5.name.len = local_e0;
    (*p_Var1)(msg,0x20,LVar5,(this->m_callbacks).m_user_data);
  }
  if (after != 0xffffffffffffffff) {
    bVar7 = has_sibling(this,node,after);
    if (bVar7) {
      bVar7 = has_sibling(this,after,node);
      if (bVar7) goto LAB_001c8931;
    }
    pcVar9 = 
    "check failed: ((after == NONE) || (has_sibling(node, after) && has_sibling(after, node)))";
    pcVar10 = msg;
    for (lVar8 = 0x5a; lVar8 != 0; lVar8 = lVar8 + -1) {
      *pcVar10 = *pcVar9;
      pcVar9 = pcVar9 + (ulong)bVar11 * -2 + 1;
      pcVar10 = pcVar10 + (ulong)bVar11 * -2 + 1;
    }
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar12 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_108 = cVar12.len;
    pcStack_110 = cVar12.str;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x6533) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x6533) << 0x40,8);
    LVar6.name.str = pcStack_110;
    LVar6.name.len = local_108;
    (*p_Var1)(msg,0x5a,LVar6,(this->m_callbacks).m_user_data);
  }
LAB_001c8931:
  _rem_hierarchy(this,node);
  iparent = parent(this,node);
  _set_hierarchy(this,node,iparent,after);
  return;
}

Assistant:

void Tree::move(size_t node, size_t after)
{
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, node != after);
    _RYML_CB_ASSERT(m_callbacks,  ! is_root(node));
    _RYML_CB_ASSERT(m_callbacks, (after == NONE) || (has_sibling(node, after) && has_sibling(after, node)));

    _rem_hierarchy(node);
    _set_hierarchy(node, parent(node), after);
}